

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall Diffusion::echo_settings(Diffusion *this)

{
  Print *this_00;
  Print *this_01;
  long in_RDI;
  int i;
  char (*in_stack_ffffffffffffee18) [26];
  Print *in_stack_ffffffffffffee20;
  Print *this_02;
  ostream *in_stack_ffffffffffffee48;
  ostream *os_;
  Print *in_stack_ffffffffffffee50;
  Print *in_stack_ffffffffffffee90;
  Print local_1120 [2];
  int local_e0c;
  undefined1 local_c79;
  ostream local_c78 [399];
  undefined1 local_ae9;
  undefined1 local_7d1;
  undefined1 local_641;
  undefined1 local_4b1;
  
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(char (*) [23])in_stack_ffffffffffffee18);
    amrex::Print::~Print(in_stack_ffffffffffffee90);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(char (*) [17])in_stack_ffffffffffffee18);
    amrex::Print::~Print(in_stack_ffffffffffffee90);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(int *)in_stack_ffffffffffffee18);
    local_4b1 = 10;
    amrex::Print::operator<<(in_stack_ffffffffffffee20,*in_stack_ffffffffffffee18);
    amrex::Print::~Print(in_stack_ffffffffffffee90);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    this_00 = amrex::Print::operator<<(in_stack_ffffffffffffee20,(int *)in_stack_ffffffffffffee18);
    local_641 = 10;
    amrex::Print::operator<<(in_stack_ffffffffffffee20,*in_stack_ffffffffffffee18);
    amrex::Print::~Print(this_00);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(int *)in_stack_ffffffffffffee18);
    local_7d1 = 10;
    amrex::Print::operator<<(in_stack_ffffffffffffee20,*in_stack_ffffffffffffee18);
    amrex::Print::~Print(this_00);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(char (*) [14])in_stack_ffffffffffffee18);
    amrex::Print::~Print(this_00);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(int *)in_stack_ffffffffffffee18);
    local_ae9 = 10;
    amrex::Print::operator<<(in_stack_ffffffffffffee20,*in_stack_ffffffffffffee18);
    amrex::Print::~Print(this_00);
    amrex::OutStream();
    os_ = local_c78;
    amrex::Print::Print(in_stack_ffffffffffffee50,os_);
    this_01 = amrex::Print::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(double *)in_stack_ffffffffffffee18);
    local_c79 = 10;
    amrex::Print::operator<<(in_stack_ffffffffffffee20,*in_stack_ffffffffffffee18);
    amrex::Print::~Print(this_00);
    amrex::OutStream();
    amrex::Print::Print(this_01,os_);
    amrex::Print::operator<<(in_stack_ffffffffffffee20,(char (*) [18])in_stack_ffffffffffffee18);
    amrex::Print::~Print(this_00);
    for (local_e0c = 0; local_e0c < *(int *)(in_RDI + 0x38); local_e0c = local_e0c + 1) {
      amrex::OutStream();
      amrex::Print::Print(this_01,os_);
      amrex::Print::operator<<(in_stack_ffffffffffffee20,(char (*) [3])in_stack_ffffffffffffee18);
      amrex::Vector<int,_std::allocator<int>_>::operator[]
                ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffee20,
                 (size_type)in_stack_ffffffffffffee18);
      amrex::Print::operator<<(in_stack_ffffffffffffee20,(int *)in_stack_ffffffffffffee18);
      amrex::Print::~Print(this_00);
    }
    amrex::OutStream();
    this_02 = local_1120;
    amrex::Print::Print(this_01,os_);
    amrex::Print::operator<<(this_02,*in_stack_ffffffffffffee18);
    amrex::Print::~Print(this_00);
  }
  return;
}

Assistant:

void
Diffusion::echo_settings () const
{
    //
    // Print out my settings.
    //
  if (verbose)
    {
        amrex::Print() << "Diffusion settings...\n";
        amrex::Print() << "  From diffuse:\n";
        amrex::Print() << "   max_order           = " << max_order           << '\n';
        amrex::Print() << "   tensor_max_order    = " << tensor_max_order    << '\n';
        amrex::Print() << "   scale_abec          = " << scale_abec          << '\n';

        amrex::Print() << "\n\n  From ns:\n";
        amrex::Print() << "   do_reflux           = " << do_reflux << '\n';
        amrex::Print() << "   visc_tol            = " << visc_tol  << '\n';

        amrex::Print() << "   is_diffusive =";
        for (int i =0; i < NUM_STATE; i++)
            amrex::Print() << "  " << is_diffusive[i];

        amrex::Print() << '\n';
    }
}